

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TheoryAxioms.cpp
# Opt level: O2

void __thiscall Shell::TheoryAxioms::addAcyclicityAxiom(TheoryAxioms *this,TermAlgebra *ta)

{
  bool bVar1;
  uint predicate;
  TermAlgebraConstructor *c;
  byte bVar2;
  TermList TVar3;
  uint i_1;
  ulong uVar4;
  uint i;
  uint uVar5;
  initializer_list<Kernel::Literal_*> lits;
  Stack<Kernel::TermList> local_58;
  Literal *local_38;
  
  predicate = TermAlgebra::getSubtermPredicate(ta);
  if (ta->_allowsCyclicTerms == false) {
    bVar2 = 0;
    for (uVar5 = 0; uVar5 < ta->_n; uVar5 = uVar5 + 1) {
      c = TermAlgebra::constructor(ta,uVar5);
      bVar1 = addSubtermDefinitions(this,predicate,c);
      bVar2 = bVar2 | bVar1;
    }
    if (bVar2 != 0) {
      local_58._cursor = (TermList *)0x0;
      local_58._end = (TermList *)0x0;
      local_58._capacity = 0;
      local_58._stack = (TermList *)0x0;
      TVar3._content = 1;
      for (uVar4 = 0; uVar5 = *(uint *)((ta->_sort)._content + 0xc) & 0xfffffff, uVar4 < uVar5;
          uVar4 = uVar4 + 1) {
        Lib::Stack<Kernel::TermList>::push(&local_58,TVar3);
        TVar3._content = TVar3._content + 4;
      }
      TVar3._content._0_4_ = uVar5 * 4 + 1;
      TVar3._content._4_4_ = 0;
      Lib::Stack<Kernel::TermList>::push(&local_58,TVar3);
      Lib::Stack<Kernel::TermList>::push
                (&local_58,
                 (TermList)((ulong)(*(uint *)((ta->_sort)._content + 0xc) & 0xfffffff) * 4 + 1));
      local_38 = Kernel::Literal::create
                           (predicate,(*(uint *)((ta->_sort)._content + 0xc) & 0xfffffff) + 2,false,
                            local_58._stack);
      lits._M_len = 1;
      lits._M_array = &local_38;
      addTheoryClauseFromLits(this,lits,TERM_ALGEBRA_ACYCLICITY_AXIOM,0);
      Lib::Stack<Kernel::TermList>::~Stack(&local_58);
    }
  }
  return;
}

Assistant:

void TheoryAxioms::addAcyclicityAxiom(TermAlgebra* ta)
{
  unsigned pred = ta->getSubtermPredicate();

  if (ta->allowsCyclicTerms()) {
    return;
  }

  bool rec = false;

  for (unsigned i = 0; i < ta->nConstructors(); i++) {
    if (addSubtermDefinitions(pred, ta->constructor(i))) {
      rec = true;
    }
  }

  // rec <=> the subterm relation is non-empty
  if (!rec) {
    return;
  }

  TermStack args;
  for (unsigned i = 0; i < ta->nTypeArgs(); i++) {
    args.push(TermList(i,false));
  }
  args.push(TermList(ta->nTypeArgs(),false));
  args.push(TermList(ta->nTypeArgs(),false));

  Literal* sub = Literal::create(pred, ta->nTypeArgs()+2, false, args.begin());
  addTheoryClauseFromLits({sub}, InferenceRule::TERM_ALGEBRA_ACYCLICITY_AXIOM,CHEAP);
}